

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CDirectiveFile.cpp
# Opt level: O1

void __thiscall CDirectiveIncbin::Encode(CDirectiveIncbin *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  ByteArray data;
  string local_50;
  ByteArray local_30;
  
  args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this->size;
  if (args != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    ByteArray::fromFile(&local_30,&this->fileName,this->start,(size_t)args);
    if ((long)(int)local_30.size_ == this->size) {
      FileManager::write(g_fileManager,(int)local_30.data_,(void *)local_30.size_,(size_t)args);
    }
    else {
      ghc::filesystem::path::u8string_abi_cxx11_(&local_50,&this->fileName);
      Logger::printError<std::__cxx11::string>((Logger *)0x1,0x19199c,(char *)&local_50,args);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
    }
    ByteArray::~ByteArray(&local_30);
  }
  return;
}

Assistant:

void CDirectiveIncbin::Encode() const
{
	if (size != 0)
	{
		ByteArray data = ByteArray::fromFile(fileName,(long)start,size);
		if ((int) data.size() != size)
		{
			Logger::printError(Logger::Error, "Could not read file \"%s\"",fileName.u8string());
			return;
		}
		g_fileManager->write(data.data(),data.size());
	}
}